

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.h
# Opt level: O3

char * __thiscall Database::MaxHeap::getResults(MaxHeap *this)

{
  ulong uVar1;
  ushort uVar2;
  uint uVar3;
  uint *puVar4;
  ushort *puVar5;
  uint *puVar6;
  uint32_t *puVar7;
  uint32_t *puVar8;
  uint16_t *puVar9;
  bool bVar10;
  int iVar11;
  char *pcVar12;
  int iVar13;
  ushort uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  
  uVar17 = (ulong)this->size;
  if (1 < uVar17) {
    puVar4 = this->c1Result;
    puVar5 = this->c2Result;
    puVar6 = this->c3Result;
    do {
      uVar15 = *puVar4;
      uVar3 = puVar4[uVar17 - 1];
      *puVar4 = uVar15 ^ uVar3;
      uVar15 = uVar15 ^ uVar3 ^ puVar4[uVar17 - 1];
      puVar4[uVar17 - 1] = uVar15;
      *puVar4 = *puVar4 ^ uVar15;
      uVar14 = *puVar5;
      uVar2 = puVar5[uVar17 - 1];
      *puVar5 = uVar14 ^ uVar2;
      uVar14 = uVar14 ^ uVar2 ^ puVar5[uVar17 - 1];
      puVar5[uVar17 - 1] = uVar14;
      *puVar5 = *puVar5 ^ uVar14;
      uVar15 = *puVar6;
      uVar3 = puVar6[uVar17 - 1];
      *puVar6 = uVar15 ^ uVar3;
      uVar15 = uVar15 ^ uVar3 ^ puVar6[uVar17 - 1];
      puVar6[uVar17 - 1] = uVar15;
      *puVar6 = *puVar6 ^ uVar15;
      if (uVar17 < 3) break;
      uVar1 = uVar17 - 1;
      puVar7 = this->c3Result;
      puVar8 = this->c1Result;
      puVar9 = this->c2Result;
      iVar16 = 0;
      iVar13 = 1;
      iVar11 = 0;
      do {
        iVar18 = iVar16 + 2;
        if (((long)uVar1 <= (long)iVar18) || (puVar7[iVar13] <= puVar7[iVar18])) {
          iVar18 = iVar13;
        }
        if (puVar7[iVar11] <= puVar7[iVar18]) break;
        uVar15 = puVar8[iVar11];
        uVar3 = puVar8[iVar18];
        puVar8[iVar11] = uVar15 ^ uVar3;
        uVar15 = uVar15 ^ uVar3 ^ puVar8[iVar18];
        puVar8[iVar18] = uVar15;
        puVar8[iVar11] = puVar8[iVar11] ^ uVar15;
        uVar14 = puVar9[iVar11];
        uVar2 = puVar9[iVar18];
        puVar9[iVar11] = uVar14 ^ uVar2;
        uVar14 = uVar14 ^ uVar2 ^ puVar9[iVar18];
        puVar9[iVar18] = uVar14;
        puVar9[iVar11] = puVar9[iVar11] ^ uVar14;
        uVar15 = puVar7[iVar11];
        uVar3 = puVar7[iVar18];
        puVar7[iVar11] = uVar15 ^ uVar3;
        uVar15 = uVar15 ^ uVar3 ^ puVar7[iVar18];
        puVar7[iVar18] = uVar15;
        puVar7[iVar11] = puVar7[iVar11] ^ uVar15;
        iVar16 = iVar18 * 2;
        iVar13 = iVar18 * 2 + 1;
        iVar11 = iVar18;
      } while ((long)iVar13 < (long)uVar1);
      bVar10 = 2 < uVar17;
      uVar17 = uVar1;
    } while (bVar10);
    uVar17 = (ulong)this->size;
  }
  pcVar12 = (char *)operator_new__(uVar17 * 0x28 + 0x28);
  builtin_strncpy(pcVar12,"l_orderkey|o_orderdate|revenue\n",0x20);
  if ((short)uVar17 != 0) {
    iVar16 = 0x1f;
    uVar17 = 0;
    do {
      if (this->c3Result[uVar17] == 0) {
        return pcVar12;
      }
      uVar14 = this->c2Result[uVar17];
      uVar15 = (uVar14 >> 4) / 0x271;
      iVar11 = sprintf(pcVar12 + iVar16,"%u|199%d-%02d-%02d|%.2f\n",
                       SUB84((double)this->c3Result[uVar17] / 100.0,0),(ulong)this->c1Result[uVar17]
                       ,(ulong)(uVar15 + 2),
                       (ulong)(((uint)uVar14 + uVar15 * -10000 & 0xffff) * 0x147b >> 0x13),
                       (ulong)((uint)uVar14 + ((uVar14 >> 2) / 0x19) * -100 & 0xffff));
      iVar16 = iVar16 + iVar11;
      uVar17 = uVar17 + 1;
    } while (uVar17 < this->size);
  }
  return pcVar12;
}

Assistant:

char* getResults() {
      for (int i = size - 1; i > 0; i--) {
        swap(0, i);
        adjust(i);
      }

      auto char_buf = new char[40 * (size + 1)];
      int pos = 0;
      pos += sprintf(char_buf, "l_orderkey|o_orderdate|revenue\n");
      for (int i = 0; i < size; i++) {
        if (c3Result[i] > 0) {
          pos += sprintf(char_buf + pos,
                         "%u|199%d-%02d-%02d|%.2f\n", c1Result[i],
                         c2Result[i] / 10000 + 2, (c2Result[i] % 10000) / 100, c2Result[i] % 100,
                         (double) c3Result[i] / 100.0);
        } else {
          break;
        }
      }
      return char_buf;
    }